

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  FieldDescriptor *descriptor;
  Descriptor *descriptor_00;
  ImmutableMessageLiteGenerator local_c8;
  int local_70;
  int i_1;
  ImmutableExtensionLiteGenerator local_60;
  int local_1c;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_1c = 0;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = Descriptor::extension_count((this->super_MessageGenerator).descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor = Descriptor::extension((this->super_MessageGenerator).descriptor_,local_1c);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              (&local_60,descriptor,this->context_);
    ImmutableExtensionLiteGenerator::GenerateRegistrationCode(&local_60,pPStack_18);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator(&local_60);
    local_1c = local_1c + 1;
  }
  local_70 = 0;
  while( true ) {
    iVar1 = local_70;
    iVar2 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor_00 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_70);
    ImmutableMessageLiteGenerator(&local_c8,descriptor_00,this->context_);
    GenerateExtensionRegistrationCode(&local_c8,pPStack_18);
    ~ImmutableMessageLiteGenerator(&local_c8);
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode(
    io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateExtensionRegistrationCode(printer);
  }
}